

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateInitializers
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  bool bVar2;
  ImmutableFieldLiteGenerator *pIVar3;
  long lVar4;
  int i;
  long lVar5;
  
  lVar4 = 0;
  for (lVar5 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_, lVar5 < *(int *)(pDVar1 + 4);
      lVar5 = lVar5 + 1) {
    bVar2 = IsRealOneof((FieldDescriptor *)(*(long *)(pDVar1 + 0x28) + lVar4));
    if (!bVar2) {
      pIVar3 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (&this->field_generators_,
                          (FieldDescriptor *)
                          (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar4));
      (*pIVar3->_vptr_ImmutableFieldLiteGenerator[6])(pIVar3,printer);
    }
    lVar4 = lVar4 + 0x48;
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateInitializers(io::Printer* printer) {
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!IsRealOneof(descriptor_->field(i))) {
      field_generators_.get(descriptor_->field(i))
          .GenerateInitializationCode(printer);
    }
  }
}